

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.c
# Opt level: O3

field_element_t
polynomial_eval_log_lut(field_t field,polynomial_t poly_log,field_logarithm_t *val_exp)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  
  if (*val_exp != '\0') {
    uVar3 = 0;
    bVar1 = 0;
    do {
      uVar2 = (ulong)poly_log.coeff[uVar3];
      if (uVar2 != 0) {
        bVar1 = bVar1 ^ field.exp[val_exp[uVar3] + uVar2];
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 <= poly_log.order);
    return bVar1;
  }
  uVar2 = (ulong)*poly_log.coeff;
  if (uVar2 != 0) {
    return field.exp[uVar2];
  }
  return '\0';
}

Assistant:

field_element_t polynomial_eval_log_lut(field_t field, polynomial_t poly_log, const field_logarithm_t *val_exp) {
    // evaluate the log_polynomial poly at a particular element val
    // like polynomial_eval_lut, the logarithms of the successive powers of val have been
    //   precomputed
    if (val_exp[0] == 0) {
        if (poly_log.coeff[0] == 0) {
            // special case for the non-existant log case
            return 0;
        }
        return field.exp[poly_log.coeff[0]];
    }

    field_element_t res = 0;

    for (unsigned int i = 0; i <= poly_log.order; i++) {
        // using 0 as a sentinel value in log -- log(0) is really -inf
        if (poly_log.coeff[i] != 0) {
            // multiply-accumulate by the next coeff times the next power of val
            res = field_add(field, res,
                    field_mul_log_element(field, poly_log.coeff[i], val_exp[i]));
        }
    }
    return res;
}